

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O1

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  Reporter *pRVar4;
  int *piVar5;
  void *pvVar6;
  uint32_t uVar7;
  uint64_t uVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  Status status;
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = 5;
  do {
    uVar3 = (this->buffer_).size_;
    if (6 < uVar3) {
      piVar5 = (int *)(this->buffer_).data_;
      uVar1 = *(ushort *)(piVar5 + 1);
      uVar11 = (ulong)(uVar1 + 7);
      if (uVar3 < uVar11) {
        (this->buffer_).data_ = "";
        (this->buffer_).size_ = 0;
        uVar10 = 5;
        if (this->eof_ != false) break;
        ReportCorruption(this,uVar3,"bad record length");
      }
      else {
        uVar10 = (uint)*(char *)((long)piVar5 + 6);
        if ((*(char *)((long)piVar5 + 6) == '\0') && (uVar1 == 0)) {
          (this->buffer_).data_ = "";
          (this->buffer_).size_ = 0;
        }
        else {
          if ((this->checksum_ == true) &&
             (iVar2 = *piVar5,
             uVar7 = crc32c::Extend(0,(char *)((long)piVar5 + 6),(ulong)(uVar1 + 1)),
             uVar7 != ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
            uVar8 = (this->buffer_).size_;
            (this->buffer_).data_ = "";
            (this->buffer_).size_ = 0;
            ReportCorruption(this,uVar8,"checksum mismatch");
            uVar10 = 6;
            break;
          }
          uVar3 = (this->buffer_).size_;
          sVar9 = uVar3 - uVar11;
          if (uVar3 < uVar11) {
            __assert_fail("n <= size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                          ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
          }
          (this->buffer_).data_ = (this->buffer_).data_ + uVar11;
          (this->buffer_).size_ = sVar9;
          if (this->initial_offset_ <= (this->end_of_buffer_offset_ - (sVar9 + uVar1)) - 7) {
            result->data_ = (char *)((long)piVar5 + 7);
            result->size_ = (ulong)uVar1;
            break;
          }
          result->data_ = "";
          result->size_ = 0;
        }
      }
      uVar10 = 6;
      break;
    }
    (this->buffer_).data_ = "";
    (this->buffer_).size_ = 0;
    if (this->eof_ != false) break;
    (*this->file_->_vptr_SequentialFile[2])
              (&local_40,this->file_,0x8000,&this->buffer_,this->backing_store_);
    pvVar6 = local_40;
    uVar3 = (this->buffer_).size_;
    uVar8 = this->end_of_buffer_offset_ + uVar3;
    this->end_of_buffer_offset_ = uVar8;
    if (local_40 == (void *)0x0) {
      if (uVar3 < 0x8000) goto LAB_00d159c2;
    }
    else {
      (this->buffer_).data_ = "";
      (this->buffer_).size_ = 0;
      pRVar4 = this->reporter_;
      if ((pRVar4 != (Reporter *)0x0) &&
         (this->initial_offset_ <= (uVar8 - (this->buffer_).size_) - 0x8000)) {
        (*pRVar4->_vptr_Reporter[2])(pRVar4,0x8000,&local_40);
      }
LAB_00d159c2:
      this->eof_ = true;
    }
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
  } while (pvVar6 == (void *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar10;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice* result) {
  while (true) {
    if (buffer_.size() < kHeaderSize) {
      if (!eof_) {
        // Last read was a full read, so this is a trailer to skip
        buffer_.clear();
        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
        end_of_buffer_offset_ += buffer_.size();
        if (!status.ok()) {
          buffer_.clear();
          ReportDrop(kBlockSize, status);
          eof_ = true;
          return kEof;
        } else if (buffer_.size() < kBlockSize) {
          eof_ = true;
        }
        continue;
      } else {
        // Note that if buffer_ is non-empty, we have a truncated header at the
        // end of the file, which can be caused by the writer crashing in the
        // middle of writing the header. Instead of considering this an error,
        // just report EOF.
        buffer_.clear();
        return kEof;
      }
    }

    // Parse the header
    const char* header = buffer_.data();
    const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
    const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
    const unsigned int type = header[6];
    const uint32_t length = a | (b << 8);
    if (kHeaderSize + length > buffer_.size()) {
      size_t drop_size = buffer_.size();
      buffer_.clear();
      if (!eof_) {
        ReportCorruption(drop_size, "bad record length");
        return kBadRecord;
      }
      // If the end of the file has been reached without reading |length| bytes
      // of payload, assume the writer died in the middle of writing the record.
      // Don't report a corruption.
      return kEof;
    }

    if (type == kZeroType && length == 0) {
      // Skip zero length record without reporting any drops since
      // such records are produced by the mmap based writing code in
      // env_posix.cc that preallocates file regions.
      buffer_.clear();
      return kBadRecord;
    }

    // Check crc
    if (checksum_) {
      uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
      uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
      if (actual_crc != expected_crc) {
        // Drop the rest of the buffer since "length" itself may have
        // been corrupted and if we trust it, we could find some
        // fragment of a real log record that just happens to look
        // like a valid log record.
        size_t drop_size = buffer_.size();
        buffer_.clear();
        ReportCorruption(drop_size, "checksum mismatch");
        return kBadRecord;
      }
    }

    buffer_.remove_prefix(kHeaderSize + length);

    // Skip physical record that started before initial_offset_
    if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
        initial_offset_) {
      result->clear();
      return kBadRecord;
    }

    *result = Slice(header + kHeaderSize, length);
    return type;
  }
}